

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O2

int main(void)

{
  long lVar1;
  initializer_list<Node> __l;
  allocator_type local_d4;
  allocator local_d3;
  allocator local_d2;
  allocator local_d1;
  Node node;
  Node local_90;
  string local_50 [32];
  undefined4 local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  std::__cxx11::string::string((string *)&node,"apple",&local_d1);
  node.value = 3;
  std::__cxx11::string::string((string *)&local_90,"banana",&local_d2);
  local_90.value = 7;
  local_90.children.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_90.children.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_90.children.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string(local_50,"cherry",&local_d3);
  local_30 = 0xb;
  local_28 = 0;
  uStack_20 = 0;
  local_18 = 0;
  __l._M_len = 2;
  __l._M_array = &local_90;
  std::vector<Node,_std::allocator<Node>_>::vector(&node.children,__l,&local_d4);
  lVar1 = 0x40;
  do {
    Node::~Node((Node *)((long)&local_90.key._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x40;
  } while (lVar1 != -0x40);
  (*Node::Reflection.super_TypeDescriptor._vptr_TypeDescriptor[3])(&Node::Reflection,&node,0);
  Node::~Node(&node);
  return 0;
}

Assistant:

int main() {
    // Create an object of type Node
    Node node = {"apple", 3, {{"banana", 7, {}}, {"cherry", 11, {}}}};

    // Find Node's type descriptor
    reflect::TypeDescriptor* typeDesc = reflect::TypeResolver<Node>::get();

    // Dump a description of the Node object to the console
    typeDesc->dump(&node);

    return 0;
}